

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::setTags(TestCaseInfo *testCaseInfo,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *tags)

{
  SpecialProperties SVar1;
  SpecialProperties SVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  string lcaseTag;
  ostringstream oss;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(testCaseInfo->tags)._M_t,&tags->_M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(testCaseInfo->lcaseTags)._M_t);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  for (p_Var4 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(tags->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&oss,'[');
    poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
    std::operator<<(poVar3,']');
    toLower(&lcaseTag,(string *)(p_Var4 + 1));
    SVar1 = testCaseInfo->properties;
    SVar2 = parseSpecialTag(&lcaseTag);
    testCaseInfo->properties = SVar2 | SVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&testCaseInfo->lcaseTags,&lcaseTag);
    std::__cxx11::string::~string((string *)&lcaseTag);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&testCaseInfo->tagsAsString,(string *)&lcaseTag);
  std::__cxx11::string::~string((string *)&lcaseTag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return;
}

Assistant:

void setTags( TestCaseInfo& testCaseInfo, std::set<std::string> const& tags )
    {
        testCaseInfo.tags = tags;
        testCaseInfo.lcaseTags.clear();

        std::ostringstream oss;
        for( std::set<std::string>::const_iterator it = tags.begin(), itEnd = tags.end(); it != itEnd; ++it ) {
            oss << '[' << *it << ']';
            std::string lcaseTag = toLower( *it );
            testCaseInfo.properties = static_cast<TestCaseInfo::SpecialProperties>( testCaseInfo.properties | parseSpecialTag( lcaseTag ) );
            testCaseInfo.lcaseTags.insert( lcaseTag );
        }
        testCaseInfo.tagsAsString = oss.str();
    }